

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2f056::CommandLineParser::addOption
          (CommandLineParser *this,Option *O,SubCommand *SC)

{
  uint *puVar1;
  ushort uVar2;
  void **ppvVar3;
  bool bVar4;
  Option *this_00;
  Child CVar5;
  raw_ostream *prVar6;
  Option **Args;
  uint *puVar7;
  SmallVector<llvm::cl::Option_*,_4U> *this_01;
  uint *puVar8;
  StringRef Str;
  StringRef Str_00;
  pair<llvm::StringMapIterator<llvm::cl::Option_*>,_bool> pVar9;
  iterator __begin3;
  Option *local_60;
  Child local_58;
  Twine *pTStack_50;
  Child local_48;
  Child CStack_40;
  Option *local_38;
  
  local_60 = O;
  if ((O->ArgStr).Length == 0) {
LAB_00117715:
    bVar4 = false;
  }
  else {
    local_48 = (Child)(O->ArgStr).Data;
    CStack_40 = (Child)(O->ArgStr).Length;
    Args = &local_38;
    local_38 = O;
    pVar9 = llvm::StringMap<llvm::cl::Option*,llvm::MallocAllocator>::try_emplace<llvm::cl::Option*>
                      ((StringMap<llvm::cl::Option*,llvm::MallocAllocator> *)&SC->OptionsMap,
                       O->ArgStr,Args);
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_00117715;
    prVar6 = llvm::errs();
    prVar6 = (raw_ostream *)
             llvm::raw_ostream::write
                       (prVar6,(int)(this->ProgramName)._M_dataplus._M_p,
                        (void *)(this->ProgramName)._M_string_length,(size_t)Args);
    Str.Length = 0x1d;
    Str.Data = ": CommandLine Error: Option \'";
    prVar6 = llvm::raw_ostream::operator<<(prVar6,Str);
    prVar6 = llvm::raw_ostream::operator<<(prVar6,local_60->ArgStr);
    Str_00.Length = 0x1d;
    Str_00.Data = "\' registered more than once!\n";
    llvm::raw_ostream::operator<<(prVar6,Str_00);
    bVar4 = true;
  }
  this_00 = local_60;
  uVar2 = *(ushort *)&local_60->field_0xc;
  if ((uVar2 & 0x180) == 0x80) {
    this_01 = &SC->PositionalOpts;
  }
  else {
    if ((uVar2 >> 0xb & 1) == 0) {
      if ((uVar2 & 7) == 4) {
        if (SC->ConsumeAfterOpt != (Option *)0x0) {
          llvm::Twine::Twine((Twine *)&local_48,
                             "Cannot specify more than one option with cl::ConsumeAfter!");
          prVar6 = llvm::errs();
          llvm::cl::Option::error(this_00,(Twine *)&local_48,(StringRef)ZEXT816(0),prVar6);
          bVar4 = true;
        }
        SC->ConsumeAfterOpt = local_60;
      }
      goto LAB_001177f0;
    }
    this_01 = &SC->SinkOpts;
  }
  llvm::SmallVectorTemplateBase<llvm::cl::Option_*,_true>::push_back
            ((SmallVectorTemplateBase<llvm::cl::Option_*,_true> *)this_01,&local_60);
LAB_001177f0:
  if (bVar4) {
    llvm::report_fatal_error("inconsistency in registered CommandLine options",true);
  }
  if (llvm::cl::AllSubCommands == (SubCommand *)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              ((ManagedStaticBase *)&llvm::cl::AllSubCommands,
               llvm::object_creator<llvm::cl::SubCommand>::call,
               llvm::object_deleter<llvm::cl::SubCommand>::call);
  }
  if (llvm::cl::AllSubCommands == SC) {
    local_48 = (Child)(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
                      super_SmallPtrSetImplBase.CurArray;
    puVar1 = &(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
              super_SmallPtrSetImplBase.NumNonEmpty;
    puVar8 = &(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
              super_SmallPtrSetImplBase.CurArraySize;
    puVar7 = puVar8;
    if (local_48.twine ==
        (Twine *)(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
                 super_SmallPtrSetImplBase.SmallArray) {
      puVar7 = puVar1;
    }
    CStack_40.decUL = (unsigned_long *)(&(local_48.twine)->LHS + *puVar7);
    llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_48);
    local_58.twine = local_48.twine;
    pTStack_50 = CStack_40.twine;
    ppvVar3 = (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
              super_SmallPtrSetImplBase.CurArray;
    if (ppvVar3 ==
        (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
        super_SmallPtrSetImplBase.SmallArray) {
      puVar8 = puVar1;
    }
    local_48.decUL = (unsigned_long *)(ppvVar3 + *puVar8);
    CStack_40.decUL = local_48.decUL;
    llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_48);
    CVar5 = local_48;
    if (local_58.twine != local_48.twine) {
      do {
        if (pTStack_50 <= local_58.twine) {
          __assert_fail("Bucket < End",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                        ,0x122,
                        "const PtrTy llvm::SmallPtrSetIterator<llvm::cl::SubCommand *>::operator*() const [PtrTy = llvm::cl::SubCommand *]"
                       );
        }
        if ((SubCommand *)(local_58.stringRef)->Data != SC) {
          addOption(this,local_60,(SubCommand *)(local_58.stringRef)->Data);
        }
        local_58.twine =
             (Twine *)&((local_58.smallString)->super_SmallVectorTemplateBase<char,_true>).
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid((SmallPtrSetIteratorImpl *)&local_58);
      } while (local_58.twine != CVar5.twine);
    }
  }
  return;
}

Assistant:

void addOption(Option *O, SubCommand *SC) {
    bool HadErrors = false;
    if (O->hasArgStr()) {
      // Add argument to the argument map!
      if (!SC->OptionsMap.insert(std::make_pair(O->ArgStr, O)).second) {
        errs() << ProgramName << ": CommandLine Error: Option '" << O->ArgStr
               << "' registered more than once!\n";
        HadErrors = true;
      }
    }

    // Remember information about positional options.
    if (O->getFormattingFlag() == cl::Positional)
      SC->PositionalOpts.push_back(O);
    else if (O->getMiscFlags() & cl::Sink) // Remember sink options
      SC->SinkOpts.push_back(O);
    else if (O->getNumOccurrencesFlag() == cl::ConsumeAfter) {
      if (SC->ConsumeAfterOpt) {
        O->error("Cannot specify more than one option with cl::ConsumeAfter!");
        HadErrors = true;
      }
      SC->ConsumeAfterOpt = O;
    }

    // Fail hard if there were errors. These are strictly unrecoverable and
    // indicate serious issues such as conflicting option names or an
    // incorrectly
    // linked LLVM distribution.
    if (HadErrors)
      report_fatal_error("inconsistency in registered CommandLine options");

    // If we're adding this to all sub-commands, add it to the ones that have
    // already been registered.
    if (SC == &*AllSubCommands) {
      for (const auto Sub : RegisteredSubCommands) {
        if (SC == Sub)
          continue;
        addOption(O, Sub);
      }
    }
  }